

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFunctions.h
# Opt level: O2

bool CreateDirPath<char>(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dirname)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char slashes [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> partialpath;
  
  slashes[2] = '\0';
  slashes[0] = '\\';
  slashes[1] = '/';
  while( true ) {
    lVar4 = std::__cxx11::string::find_first_of((char *)dirname,(ulong)slashes);
    if (lVar4 == -1) {
      bVar1 = true;
      if (((1 < dirname->_M_string_length) && (iVar3 = GetFileInfo<char>(dirname), iVar3 == 1)) &&
         (bVar2 = CreateDirectory<char>(dirname), !bVar2)) {
        bVar1 = false;
        error("CreateDirectory(%s)",(dirname->_M_dataplus)._M_p);
      }
      return bVar1;
    }
    std::__cxx11::string::substr((ulong)&partialpath,(ulong)dirname);
    iVar3 = GetFileInfo<char>(&partialpath);
    if ((iVar3 == 1) && (bVar1 = CreateDirectory<char>(&partialpath), !bVar1)) break;
    std::__cxx11::string::~string((string *)&partialpath);
  }
  error("CreateDirectory([%d]%ls)",lVar4,partialpath._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&partialpath);
  return false;
}

Assistant:

bool CreateDirPath(const std::basic_string<T>& dirname)
{
    T slashes[3]= { '\\', '/', 0};
    for (size_t i= dirname.find_first_of(slashes, 1) ; i!=dirname.npos ; i= dirname.find_first_of(slashes, i+1)) {
        std::basic_string<T> partialpath= dirname.substr(0, i);
        if (GetFileInfo(partialpath)==AT_NONEXISTANT
            && !CreateDirectory(partialpath)) {
            logerror("CreateDirectory([%d]%ls)", i, partialpath.c_str());
            return false;
        }
    }
    if (dirname.size()>1 && GetFileInfo(dirname)==AT_NONEXISTANT && !CreateDirectory(dirname)) {
        logerror("CreateDirectory(%s)", dirname.c_str());
        return false;
    }
    return true;
}